

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_findi_Test<std::pair<char,_char32_t>_>::TestBody
          (UnicodeFullTest_findi_Test<std::pair<char,_char32_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  char32_t (*in_RDX) [5];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_string;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_00;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_01;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX_02;
  char *pcVar3;
  AssertionResult AVar4;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_00;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_01;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_02;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_03;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_04;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_05;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_06;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_07;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_08;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_09;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_10;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_11;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_12;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_13;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_14;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_15;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_16;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_17;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_18;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_19;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_20;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_21;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_22;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_23;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_24;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_25;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_26;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_27;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_28;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_29;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_30;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_31;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_32;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_33;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_34;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_35;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_36;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_37;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_38;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_39;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_40;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_41;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> in_substring_42;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char,_std::char_traits<char>_> in_string_02;
  basic_string_view<char,_std::char_traits<char>_> in_string_03;
  basic_string_view<char,_std::char_traits<char>_> in_string_04;
  basic_string_view<char,_std::char_traits<char>_> in_string_05;
  basic_string_view<char,_std::char_traits<char>_> in_string_06;
  basic_string_view<char,_std::char_traits<char>_> in_string_07;
  basic_string_view<char,_std::char_traits<char>_> in_string_08;
  basic_string_view<char,_std::char_traits<char>_> in_string_09;
  basic_string_view<char,_std::char_traits<char>_> in_string_10;
  basic_string_view<char,_std::char_traits<char>_> in_string_11;
  basic_string_view<char,_std::char_traits<char>_> in_string_12;
  basic_string_view<char,_std::char_traits<char>_> in_string_13;
  basic_string_view<char,_std::char_traits<char>_> in_string_14;
  basic_string_view<char,_std::char_traits<char>_> in_string_15;
  basic_string_view<char,_std::char_traits<char>_> in_string_16;
  basic_string_view<char,_std::char_traits<char>_> in_string_17;
  basic_string_view<char,_std::char_traits<char>_> in_string_18;
  basic_string_view<char,_std::char_traits<char>_> in_string_19;
  basic_string_view<char,_std::char_traits<char>_> in_string_20;
  basic_string_view<char,_std::char_traits<char>_> in_string_21;
  basic_string_view<char,_std::char_traits<char>_> in_string_22;
  basic_string_view<char,_std::char_traits<char>_> in_string_23;
  basic_string_view<char,_std::char_traits<char>_> in_string_24;
  basic_string_view<char,_std::char_traits<char>_> in_string_25;
  basic_string_view<char,_std::char_traits<char>_> in_string_26;
  basic_string_view<char,_std::char_traits<char>_> in_string_27;
  basic_string_view<char,_std::char_traits<char>_> in_string_28;
  basic_string_view<char,_std::char_traits<char>_> in_string_29;
  basic_string_view<char,_std::char_traits<char>_> in_string_30;
  basic_string_view<char,_std::char_traits<char>_> in_string_31;
  basic_string_view<char,_std::char_traits<char>_> in_string_32;
  basic_string_view<char,_std::char_traits<char>_> in_string_33;
  basic_string_view<char,_std::char_traits<char>_> in_string_34;
  basic_string_view<char,_std::char_traits<char>_> in_string_35;
  basic_string_view<char,_std::char_traits<char>_> in_string_36;
  basic_string_view<char,_std::char_traits<char>_> in_string_37;
  basic_string_view<char,_std::char_traits<char>_> in_string_38;
  basic_string_view<char,_std::char_traits<char>_> in_string_39;
  basic_string_view<char,_std::char_traits<char>_> in_string_40;
  basic_string_view<char,_std::char_traits<char>_> in_string_41;
  basic_string_view<char,_std::char_traits<char>_> in_string_42;
  basic_string_view<char,_std::char_traits<char>_> in_string_43;
  basic_string_view<char,_std::char_traits<char>_> in_string_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> double_abcd_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abcd_str;
  undefined8 local_b0;
  size_t local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  char32_t *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  long local_88;
  undefined4 local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  jessilib::string_cast<char,char32_t[5]>(&local_50,(jessilib *)L"ABCD",in_RDX);
  paVar1 = &local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity =
       (ulong)(uint)local_78.field_2._M_allocated_capacity._4_4_ << 0x20;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = paVar1;
  in_string_00._M_str = local_50._M_dataplus._M_p;
  in_string_00._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>
                       (in_string_00,
                        (basic_string_view<char32_t,_std::char_traits<char32_t>_>)(auVar2 << 0x40));
  local_b0 = (ulong)local_b0._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x14d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x41;
  local_78._M_string_length = 1;
  in_substring._M_str = (char32_t *)paVar1;
  in_substring._M_len = 1;
  in_string_01._M_str = local_50._M_dataplus._M_p;
  in_string_01._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_01,in_substring);
  local_b0 = local_b0 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x150,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x42;
  local_78._M_string_length = 1;
  in_substring_00._M_str = (char32_t *)paVar1;
  in_substring_00._M_len = 1;
  in_string_02._M_str = local_50._M_dataplus._M_p;
  in_string_02._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_02,in_substring_00);
  local_b0 = CONCAT44(local_b0._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))","1",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x151,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x43;
  local_78._M_string_length = 1;
  in_substring_01._M_str = (char32_t *)paVar1;
  in_substring_01._M_len = 1;
  in_string_03._M_str = local_50._M_dataplus._M_p;
  in_string_03._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_03,in_substring_01);
  local_b0 = CONCAT44(local_b0._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))","2",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x152,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x44;
  local_78._M_string_length = 1;
  in_substring_02._M_str = (char32_t *)paVar1;
  in_substring_02._M_len = 1;
  in_string_04._M_str = local_50._M_dataplus._M_p;
  in_string_04._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_04,in_substring_02);
  local_b0 = CONCAT44(local_b0._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))","3",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x153,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x45;
  local_78._M_string_length = 1;
  in_substring_03._M_str = (char32_t *)paVar1;
  in_substring_03._M_len = 1;
  in_string_05._M_str = local_50._M_dataplus._M_p;
  in_string_05._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_05,in_substring_03);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))",
             "decltype(abcd_str)::npos",&local_a8,&std::__cxx11::string::npos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x154,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x61;
  local_78._M_string_length = 1;
  in_substring_04._M_str = (char32_t *)paVar1;
  in_substring_04._M_len = 1;
  in_string_06._M_str = local_50._M_dataplus._M_p;
  in_string_06._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_06,in_substring_04);
  local_b0 = local_b0 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"a\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x155,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x62;
  local_78._M_string_length = 1;
  in_substring_05._M_str = (char32_t *)paVar1;
  in_substring_05._M_len = 1;
  in_string_07._M_str = local_50._M_dataplus._M_p;
  in_string_07._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_07,in_substring_05);
  local_b0 = CONCAT44(local_b0._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"b\"))","1",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x156,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 99;
  local_78._M_string_length = 1;
  in_substring_06._M_str = (char32_t *)paVar1;
  in_substring_06._M_len = 1;
  in_string_08._M_str = local_50._M_dataplus._M_p;
  in_string_08._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_08,in_substring_06);
  local_b0 = CONCAT44(local_b0._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"c\"))","2",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x157,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 100;
  local_78._M_string_length = 1;
  in_substring_07._M_str = (char32_t *)paVar1;
  in_substring_07._M_len = 1;
  in_string_09._M_str = local_50._M_dataplus._M_p;
  in_string_09._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_09,in_substring_07);
  local_b0 = CONCAT44(local_b0._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"d\"))","3",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x158,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x65;
  local_78._M_string_length = 1;
  in_substring_08._M_str = (char32_t *)paVar1;
  in_substring_08._M_len = 1;
  in_string_10._M_str = local_50._M_dataplus._M_p;
  in_string_10._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_10,in_substring_08);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"e\"))",
             "decltype(abcd_str)::npos",&local_a8,&std::__cxx11::string::npos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x159,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4200000041;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_09._M_str = (char32_t *)paVar1;
  in_substring_09._M_len = 2;
  in_string_11._M_str = local_50._M_dataplus._M_p;
  in_string_11._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_11,in_substring_09);
  local_b0 = local_b0 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4300000042;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_10._M_str = (char32_t *)paVar1;
  in_substring_10._M_len = 2;
  in_string_12._M_str = local_50._M_dataplus._M_p;
  in_string_12._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_12,in_substring_10);
  local_b0 = CONCAT44(local_b0._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))","1",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4400000043;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_11._M_str = (char32_t *)paVar1;
  in_substring_11._M_len = 2;
  in_string_13._M_str = local_50._M_dataplus._M_p;
  in_string_13._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_13,in_substring_11);
  local_b0 = CONCAT44(local_b0._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))","2",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x4100000044;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_12._M_str = (char32_t *)paVar1;
  in_substring_12._M_len = 2;
  in_string_14._M_str = local_50._M_dataplus._M_p;
  in_string_14._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_14,in_substring_12);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))",
             "decltype(abcd_str)::npos",&local_a8,&std::__cxx11::string::npos);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x15f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x6200000061;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_13._M_str = (char32_t *)paVar1;
  in_substring_13._M_len = 2;
  in_string_15._M_str = local_50._M_dataplus._M_p;
  in_string_15._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_15,in_substring_13);
  local_b0 = local_b0 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"ab\"))","0",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x160,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x6300000062;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_14._M_str = (char32_t *)paVar1;
  in_substring_14._M_len = 2;
  in_string_16._M_str = local_50._M_dataplus._M_p;
  in_string_16._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_16,in_substring_14);
  local_b0 = CONCAT44(local_b0._4_4_,1);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"bc\"))","1",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x161,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x6400000063;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_15._M_str = (char32_t *)paVar1;
  in_substring_15._M_len = 2;
  in_string_17._M_str = local_50._M_dataplus._M_p;
  in_string_17._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_17,in_substring_15);
  local_b0 = CONCAT44(local_b0._4_4_,2);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_98,
             "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"cd\"))","2",
             &local_a8,(int *)&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x162,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
  }
  local_78.field_2._M_allocated_capacity = 0x6100000064;
  local_78._M_string_length = 2;
  local_78.field_2._8_4_ = 0;
  in_substring_16._M_str = (char32_t *)paVar1;
  in_substring_16._M_len = 2;
  in_string_18._M_str = local_50._M_dataplus._M_p;
  in_string_18._M_len = local_50._M_string_length;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  local_a8 = jessilib::find<char,char32_t,false>(in_string_18,in_substring_16);
  AVar4 = testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                    ((internal *)&local_98,
                     "findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"da\"))"
                     ,"decltype(abcd_str)::npos",&local_a8,&std::__cxx11::string::npos);
  in_string._M_head_impl =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AVar4.message_._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity * 4 + 4);
    in_string = extraout_RDX.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  }
  if (local_98._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_90 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_90->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x163,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a8,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a8);
    in_string._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         extraout_RDX_00.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
      in_string._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           extraout_RDX_01.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
    }
  }
  if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_90,local_90);
    in_string = extraout_RDX_02.
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl;
  }
  jessilib::string_cast<char,char32_t[9]>
            (&local_78,(jessilib *)L"AABBCCDD",(char32_t (*) [9])in_string._M_head_impl);
  local_88 = 0x41;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_17._M_str = (char32_t *)&local_88;
  in_substring_17._M_len = 1;
  in_string_19._M_str = local_78._M_dataplus._M_p;
  in_string_19._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_19,in_substring_17);
  local_54 = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"A\"))"
             ,"0",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x168,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x42;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_18._M_str = (char32_t *)&local_88;
  in_substring_18._M_len = 1;
  in_string_20._M_str = local_78._M_dataplus._M_p;
  in_string_20._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_20,in_substring_18);
  local_54 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"B\"))"
             ,"2",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x169,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x43;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_19._M_str = (char32_t *)&local_88;
  in_substring_19._M_len = 1;
  in_string_21._M_str = local_78._M_dataplus._M_p;
  in_string_21._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_21,in_substring_19);
  local_54 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"C\"))"
             ,"4",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x44;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_20._M_str = (char32_t *)&local_88;
  in_substring_20._M_len = 1;
  in_string_22._M_str = local_78._M_dataplus._M_p;
  in_string_22._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_22,in_substring_20);
  local_54 = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"D\"))"
             ,"6",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x45;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_21._M_str = (char32_t *)&local_88;
  in_substring_21._M_len = 1;
  in_string_23._M_str = local_78._M_dataplus._M_p;
  in_string_23._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_23,in_substring_21);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"E\"))"
             ,"decltype(double_abcd_str)::npos",&local_b0,&std::__cxx11::string::npos);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x61;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_22._M_str = (char32_t *)&local_88;
  in_substring_22._M_len = 1;
  in_string_24._M_str = local_78._M_dataplus._M_p;
  in_string_24._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_24,in_substring_22);
  local_54 = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"a\"))"
             ,"0",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x62;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_23._M_str = (char32_t *)&local_88;
  in_substring_23._M_len = 1;
  in_string_25._M_str = local_78._M_dataplus._M_p;
  in_string_25._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_25,in_substring_23);
  local_54 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"b\"))"
             ,"2",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 99;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_24._M_str = (char32_t *)&local_88;
  in_substring_24._M_len = 1;
  in_string_26._M_str = local_78._M_dataplus._M_p;
  in_string_26._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_26,in_substring_24);
  local_54 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"c\"))"
             ,"4",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x16f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 100;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_25._M_str = (char32_t *)&local_88;
  in_substring_25._M_len = 1;
  in_string_27._M_str = local_78._M_dataplus._M_p;
  in_string_27._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_27,in_substring_25);
  local_54 = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"d\"))"
             ,"6",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x170,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x65;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  in_substring_26._M_str = (char32_t *)&local_88;
  in_substring_26._M_len = 1;
  in_string_28._M_str = local_78._M_dataplus._M_p;
  in_string_28._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_28,in_substring_26);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"e\"))"
             ,"decltype(double_abcd_str)::npos",&local_b0,&std::__cxx11::string::npos);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x171,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4100000041;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_27._M_str = (char32_t *)&local_88;
  in_substring_27._M_len = 2;
  in_string_29._M_str = local_78._M_dataplus._M_p;
  in_string_29._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_29,in_substring_27);
  local_54 = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AA\"))"
             ,"0",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x174,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4200000041;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_28._M_str = (char32_t *)&local_88;
  in_substring_28._M_len = 2;
  in_string_30._M_str = local_78._M_dataplus._M_p;
  in_string_30._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_30,in_substring_28);
  local_54 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"AB\"))"
             ,"1",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x175,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4200000042;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_29._M_str = (char32_t *)&local_88;
  in_substring_29._M_len = 2;
  in_string_31._M_str = local_78._M_dataplus._M_p;
  in_string_31._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_31,in_substring_29);
  local_54 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BB\"))"
             ,"2",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x176,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4300000042;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_30._M_str = (char32_t *)&local_88;
  in_substring_30._M_len = 2;
  in_string_32._M_str = local_78._M_dataplus._M_p;
  in_string_32._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_32,in_substring_30);
  local_54 = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"BC\"))"
             ,"3",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x177,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4300000043;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_31._M_str = (char32_t *)&local_88;
  in_substring_31._M_len = 2;
  in_string_33._M_str = local_78._M_dataplus._M_p;
  in_string_33._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_33,in_substring_31);
  local_54 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CC\"))"
             ,"4",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x178,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4400000043;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_32._M_str = (char32_t *)&local_88;
  in_substring_32._M_len = 2;
  in_string_34._M_str = local_78._M_dataplus._M_p;
  in_string_34._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_34,in_substring_32);
  local_54 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"CD\"))"
             ,"5",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x179,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4400000044;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_33._M_str = (char32_t *)&local_88;
  in_substring_33._M_len = 2;
  in_string_35._M_str = local_78._M_dataplus._M_p;
  in_string_35._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_35,in_substring_33);
  local_54 = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DD\"))"
             ,"6",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x4100000044;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_34._M_str = (char32_t *)&local_88;
  in_substring_34._M_len = 2;
  in_string_36._M_str = local_78._M_dataplus._M_p;
  in_string_36._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_36,in_substring_34);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"DA\"))"
             ,"decltype(double_abcd_str)::npos",&local_b0,&std::__cxx11::string::npos);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6100000061;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_35._M_str = (char32_t *)&local_88;
  in_substring_35._M_len = 2;
  in_string_37._M_str = local_78._M_dataplus._M_p;
  in_string_37._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_37,in_substring_35);
  local_54 = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"aa\"))"
             ,"0",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6200000061;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_36._M_str = (char32_t *)&local_88;
  in_substring_36._M_len = 2;
  in_string_38._M_str = local_78._M_dataplus._M_p;
  in_string_38._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_38,in_substring_36);
  local_54 = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"ab\"))"
             ,"1",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6200000062;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_37._M_str = (char32_t *)&local_88;
  in_substring_37._M_len = 2;
  in_string_39._M_str = local_78._M_dataplus._M_p;
  in_string_39._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_39,in_substring_37);
  local_54 = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"bb\"))"
             ,"2",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6300000062;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_38._M_str = (char32_t *)&local_88;
  in_substring_38._M_len = 2;
  in_string_40._M_str = local_78._M_dataplus._M_p;
  in_string_40._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_40,in_substring_38);
  local_54 = 3;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"bc\"))"
             ,"3",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x17f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6300000063;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_39._M_str = (char32_t *)&local_88;
  in_substring_39._M_len = 2;
  in_string_41._M_str = local_78._M_dataplus._M_p;
  in_string_41._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_41,in_substring_39);
  local_54 = 4;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"cc\"))"
             ,"4",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x180,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6400000063;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_40._M_str = (char32_t *)&local_88;
  in_substring_40._M_len = 2;
  in_string_42._M_str = local_78._M_dataplus._M_p;
  in_string_42._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_42,in_substring_40);
  local_54 = 5;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"cd\"))"
             ,"5",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x181,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6400000064;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_41._M_str = (char32_t *)&local_88;
  in_substring_41._M_len = 2;
  in_string_43._M_str = local_78._M_dataplus._M_p;
  in_string_43._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_43,in_substring_41);
  local_54 = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"dd\"))"
             ,"6",&local_b0,&local_54);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x182,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  local_88 = 0x6100000064;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  local_80 = 0;
  in_substring_42._M_str = (char32_t *)&local_88;
  in_substring_42._M_len = 2;
  in_string_44._M_str = local_78._M_dataplus._M_p;
  in_string_44._M_len = local_78._M_string_length;
  local_98 = (char32_t *)&local_88;
  local_b0 = jessilib::find<char,char32_t,false>(in_string_44,in_substring_42);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_a8,
             "findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U\"da\"))"
             ,"decltype(double_abcd_str)::npos",&local_b0,&std::__cxx11::string::npos);
  if (local_98 != (char32_t *)&local_88) {
    operator_delete(local_98,local_88 * 4 + 4);
  }
  if (local_a8._0_1_ == (AssertHelper)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_a0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (local_a0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x183,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if (local_98 != (char32_t *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  if (local_a0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a0,local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST(UnicodeFullTest, findi) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");

	// Empty substring
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"")), 0);

	// Single-characters
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 3);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(abcd_str)::npos);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"a")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"b")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"c")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"d")), 3);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"e")), decltype(abcd_str)::npos);

	// Two characters
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(abcd_str)::npos);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"ab")), 0);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bc")), 1);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cd")), 2);
	EXPECT_EQ(findi(abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"da")), decltype(abcd_str)::npos);

	auto double_abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"AABBCCDD");

	// Single-characters
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"A")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"B")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"C")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"D")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"E")), decltype(double_abcd_str)::npos);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"a")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"b")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"c")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"d")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"e")), decltype(double_abcd_str)::npos);

	// Two characters
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AA")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"AB")), 1);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BB")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"BC")), 3);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CC")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"CD")), 5);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DD")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"DA")), decltype(double_abcd_str)::npos);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"aa")), 0);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"ab")), 1);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bb")), 2);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"bc")), 3);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cc")), 4);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"cd")), 5);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"dd")), 6);
	EXPECT_EQ(findi(double_abcd_str, jessilib::string_cast<typename TypeParam::second_type>(U"da")), decltype(double_abcd_str)::npos);
}